

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestAds::testAdsReadReqEx2(TestAds *this,string *param_1)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  byte bVar4;
  int i;
  int iVar5;
  bool bVar6;
  uint32_t bytesRead;
  uint32_t buffer;
  string local_68;
  long local_48;
  uint32_t outBuffer;
  AmsAddr unknown;
  
  lVar1 = AdsPortOpenEx();
  fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 != 0,&local_68,"0 != port",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x138);
  std::__cxx11::string::~string((string *)&local_68);
  print(&server,this->out);
  outBuffer = 0;
  local_48 = lVar1;
  lVar1 = AdsSyncWriteReqEx(lVar1,(AmsAddr *)&server,0x4020,0,4,&outBuffer);
  fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0,&local_68,
             "0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x13d);
  std::__cxx11::string::~string((string *)&local_68);
  for (iVar5 = 0; iVar5 != 10; iVar5 = iVar5 + 1) {
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    lVar1 = AdsSyncReadReqEx2(local_48,(AmsAddr *)&server,0x4020,0,4,&buffer,&bytesRead);
    bVar4 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
    if ((lVar1 != 0) != (bool)bVar4) {
      poVar2 = std::operator<<((ostream *)&std::cout,"i");
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar5);
      std::operator<<(poVar2,"\n");
      bVar6 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
      fructose::test_root::test_assert
                ((test_root *)this,bVar6,&local_68,
                 "0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead)"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x148);
      std::__cxx11::string::~string((string *)&local_68);
      bVar4 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
    }
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    if ((bytesRead != 4) != (bool)(bVar4 & 1)) {
      poVar2 = std::operator<<((ostream *)&std::cout,"i");
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar5);
      std::operator<<(poVar2,"\n");
      bVar6 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
      fructose::test_root::test_assert
                ((test_root *)this,bVar6,&local_68,"sizeof(buffer) == bytesRead",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x149);
      std::__cxx11::string::~string((string *)&local_68);
      bVar4 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
    }
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    if ((buffer != 0) != (bool)(bVar4 & 1)) {
      poVar2 = std::operator<<((ostream *)&std::cout,"i");
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar5);
      std::operator<<(poVar2,"\n");
      bVar6 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
      fructose::test_root::test_assert
                ((test_root *)this,bVar6,&local_68,"0 == buffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x14a);
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  bytesRead = 0xdeadbeef;
  lVar1 = AdsSyncReadReqEx2(0,(AmsAddr *)&server,0x4020,0,4,&buffer,&bytesRead);
  fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x748,&local_68,
             "ADSERR_CLIENT_PORTNOTOPEN == AdsSyncReadReqEx2(0, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x150);
  std::__cxx11::string::~string((string *)&local_68);
  bVar6 = bytesRead == 0xdeadbeef;
  fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,bVar6,&local_68,"0xDEADBEEF == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x151);
  lVar1 = local_48;
  std::__cxx11::string::~string((string *)&local_68);
  bytesRead = 0xdeadbeef;
  lVar3 = AdsSyncReadReqEx2(lVar1,(AmsAddr *)0x0,0x4020,0,4,&buffer,&bytesRead);
  fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar3 == 0x749,&local_68,
             "ADSERR_CLIENT_NOAMSADDR == AdsSyncReadReqEx2(port, nullptr, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x156);
  std::__cxx11::string::~string((string *)&local_68);
  bVar6 = bytesRead == 0xdeadbeef;
  fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,bVar6,&local_68,"0xDEADBEEF == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x157);
  std::__cxx11::string::~string((string *)&local_68);
  bytesRead = 0xdeadbeef;
  AmsNetId::AmsNetId(&unknown.netId,'\x01','\x02','\x03','\x04','\x05','\x06');
  unknown.port = 0x353;
  lVar3 = AdsSyncReadReqEx2(lVar1,(AmsAddr *)&unknown,0x4020,0,4,&buffer,&bytesRead);
  fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar3 == 7,&local_68,
             "GLOBALERR_MISSING_ROUTE == AdsSyncReadReqEx2(port, &unknown, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x15d);
  std::__cxx11::string::~string((string *)&local_68);
  bVar6 = bytesRead == 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,bVar6,&local_68,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x15e);
  std::__cxx11::string::~string((string *)&local_68);
  buffer = 0xdeadbeef;
  lVar3 = AdsSyncReadReqEx2(lVar1,(AmsAddr *)&server,0x4020,0,4,&buffer,(uint *)0x0);
  fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar3 == 0,&local_68,
             "0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, nullptr)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x162);
  std::__cxx11::string::~string((string *)&local_68);
  bVar6 = buffer == 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,bVar6,&local_68,"0 == buffer",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x163);
  std::__cxx11::string::~string((string *)&local_68);
  lVar3 = AdsSyncReadReqEx2(lVar1,(AmsAddr *)&server,0x4020,0,4,(void *)0x0,(uint *)0x0);
  fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar3 == 0x741,&local_68,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), nullptr, nullptr)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x167);
  std::__cxx11::string::~string((string *)&local_68);
  lVar3 = AdsSyncReadReqEx2(lVar1,(AmsAddr *)&server,0x4020,0,4,(void *)0x0,&bytesRead);
  fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar3 == 0x741,&local_68,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), nullptr, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x169);
  std::__cxx11::string::~string((string *)&local_68);
  bytesRead = 0xdeadbeef;
  lVar3 = AdsSyncReadReqEx2(lVar1,(AmsAddr *)&server,0x4020,0,0,&buffer,&bytesRead);
  fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar3 == 0,&local_68,
             "0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, 0, &buffer, &bytesRead)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x16d);
  std::__cxx11::string::~string((string *)&local_68);
  bVar6 = bytesRead == 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,bVar6,&local_68,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x16e);
  std::__cxx11::string::~string((string *)&local_68);
  bytesRead = 0xdeadbeef;
  lVar3 = AdsSyncReadReqEx2(lVar1,(AmsAddr *)&server,0,0,4,&buffer,&bytesRead);
  fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar3 == 0x701,&local_68,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncReadReqEx2(port, &server, 0, 0, sizeof(buffer), &buffer, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x174);
  std::__cxx11::string::~string((string *)&local_68);
  bVar6 = bytesRead == 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,bVar6,&local_68,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x175);
  std::__cxx11::string::~string((string *)&local_68);
  bytesRead = 0xdeadbeef;
  lVar3 = AdsSyncReadReqEx2(lVar1,(AmsAddr *)&server,0x4025,0x10000,4,&buffer,&bytesRead);
  fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar3 == 0x701,&local_68,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncReadReqEx2(port, &server, 0x4025, 0x10000, sizeof(buffer), &buffer, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x17a);
  std::__cxx11::string::~string((string *)&local_68);
  bVar6 = bytesRead == 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,bVar6,&local_68,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x17b);
  std::__cxx11::string::~string((string *)&local_68);
  lVar1 = AdsPortCloseEx(lVar1);
  fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0,&local_68,"0 == AdsPortCloseEx(port)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x17c);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void testAdsReadReqEx2(const std::string&)
    {
        const long port = AdsPortOpenEx();
        fructose_assert(0 != port);

        print(server, out);

        const uint32_t outBuffer = 0;
        fructose_assert(0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer));

        uint32_t bytesRead;
        uint32_t buffer;
        for (int i = 0; i < NUM_TEST_LOOPS; ++i) {
            fructose_loop_assert(i, 0 == AdsSyncReadReqEx2(port,
                                                           &server,
                                                           0x4020,
                                                           0,
                                                           sizeof(buffer),
                                                           &buffer,
                                                           &bytesRead));
            fructose_loop_assert(i, sizeof(buffer) == bytesRead);
            fructose_loop_assert(i, 0 == buffer);
        }

        // provide out of range port
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_CLIENT_PORTNOTOPEN ==
                        AdsSyncReadReqEx2(0, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead));
        fructose_assert(0xDEADBEEF == bytesRead); // BUG? TcAdsDll doesn't reset bytesRead!

        // provide nullptr to AmsAddr
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_CLIENT_NOAMSADDR ==
                        AdsSyncReadReqEx2(port, nullptr, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead));
        fructose_assert(0xDEADBEEF == bytesRead); // BUG? TcAdsDll doesn't reset bytesRead!

        // provide unknown AmsAddr
        bytesRead = 0xDEADBEEF;
        AmsAddr unknown { { 1, 2, 3, 4, 5, 6 }, AMSPORT_R0_PLC_TC3 };
        fructose_assert(GLOBALERR_MISSING_ROUTE ==
                        AdsSyncReadReqEx2(port, &unknown, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead));
        fructose_assert(0 == bytesRead);

        // provide nullptr to bytesRead
        buffer = 0xDEADBEEF;
        fructose_assert(0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, nullptr));
        fructose_assert(0 == buffer);

        // provide nullptr to buffer
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), nullptr, nullptr));
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), nullptr, &bytesRead));

        // provide 0 length buffer
        bytesRead = 0xDEADBEEF;
        fructose_assert(0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, 0, &buffer, &bytesRead));
        fructose_assert(0 == bytesRead);
        //TODO is this a bug? Shouldn't the request fail with ADSERR_DEVICE_INVALIDSIZE?

        // provide invalid indexGroup
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP ==
                        AdsSyncReadReqEx2(port, &server, 0, 0, sizeof(buffer), &buffer, &bytesRead));
        fructose_assert(0 == bytesRead);

        // provide invalid indexOffset
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP ==
                        AdsSyncReadReqEx2(port, &server, 0x4025, 0x10000, sizeof(buffer), &buffer, &bytesRead));
        fructose_assert(0 == bytesRead);
        fructose_assert(0 == AdsPortCloseEx(port));
    }